

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

bool __thiscall
ON_ObjectRenderingAttributes::IsValid(ON_ObjectRenderingAttributes *this,ON_TextLog *text_log)

{
  ulong uVar1;
  int iVar2;
  ON_MappingRef *pOVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  ON_MappingRef *pOVar7;
  ulong uVar8;
  ON_MappingRef *pOVar9;
  ulong uVar10;
  ON_UUID plugin_id;
  ON_UUID local_48;
  
  bVar4 = ON_RenderingAttributes::IsValid(&this->super_ON_RenderingAttributes,text_log);
  if (bVar4) {
    iVar2 = (this->m_mappings).m_count;
    bVar4 = true;
    if (1 < (long)iVar2) {
      pOVar3 = (this->m_mappings).m_a;
      uVar10 = 1;
      uVar6 = 0;
      pOVar7 = pOVar3;
      do {
        pOVar7 = pOVar7 + 1;
        pOVar9 = pOVar3 + uVar6;
        local_48.Data1 = (pOVar9->m_plugin_id).Data1;
        local_48.Data2 = (pOVar9->m_plugin_id).Data2;
        local_48.Data3 = (pOVar9->m_plugin_id).Data3;
        local_48.Data4 = *&(pOVar9->m_plugin_id).Data4;
        uVar1 = uVar6 + 1;
        uVar8 = uVar10;
        pOVar9 = pOVar7;
        do {
          iVar5 = ON_UuidCompare(&local_48,&pOVar9->m_plugin_id);
          if (iVar5 == 0) {
            if (text_log != (ON_TextLog *)0x0) {
              ON_TextLog::Print(text_log,
                                "ON_ObjectRenderingAttributes error: m_mappings[%d] and m_mappings[%d] have the same plug-in id.\n"
                                ,uVar6,uVar8 & 0xffffffff);
            }
            goto LAB_004e6e77;
          }
          uVar8 = uVar8 + 1;
          pOVar9 = pOVar9 + 1;
        } while ((long)iVar2 != uVar8);
        uVar10 = uVar10 + 1;
        uVar6 = uVar1;
      } while (uVar1 != iVar2 - 1);
      bVar4 = true;
    }
  }
  else {
LAB_004e6e77:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool ON_ObjectRenderingAttributes::IsValid( ON_TextLog* text_log ) const
{
  if ( !ON_RenderingAttributes::IsValid(text_log) )
    return false;

  // plug-in uuids must be unique
  int count;
  if( (count = m_mappings.Count()) > 1 )
  {
    const ON_MappingRef* mr = m_mappings.Array();
    ON_UUID plugin_id;
    int i, j;
    for ( i = 0; i < count-1; i++ )
    {
      plugin_id = mr[i].m_plugin_id;
      for ( j = i+1; j < count; j++ )
      {
        if ( !ON_UuidCompare(&plugin_id,&mr[j].m_plugin_id ) )
        {
          if( text_log )
          {
            text_log->Print("ON_ObjectRenderingAttributes error: m_mappings[%d] and m_mappings[%d] have the same plug-in id.\n",i,j);
          }
          return false;
        }
      }
    }
  }

  return true;
}